

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O0

void convolve_y_sr_12tap_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int in_ECX;
  long in_RDX;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  __m128i *s_00;
  undefined8 extraout_XMM0_Qa_00;
  __m128i *extraout_XMM0_Qa_01;
  int iVar9;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  int iVar10;
  undefined1 auVar8 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  int i;
  uint8_t *data;
  __m128i res;
  __m128i res16;
  __m128i res_hi_round;
  __m128i res_lo_round;
  __m128i res_hi;
  __m128i res_lo;
  __m128i src10;
  __m128i s [12];
  int j;
  __m128i coeffs [6];
  __m128i round_shift;
  __m128i round_const;
  uint8_t *src_ptr;
  int fo_vert;
  __m128i *in_stack_fffffffffffff778;
  undefined8 in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  int iVar11;
  int in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d4;
  __m128i *in_stack_fffffffffffff7d8;
  __m128i *s_01;
  undefined4 local_72c;
  undefined8 local_668;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined2 local_378;
  undefined2 uStack_376;
  undefined2 uStack_374;
  undefined2 uStack_372;
  undefined2 uStack_370;
  undefined2 uStack_36e;
  undefined2 uStack_36c;
  undefined2 uStack_36a;
  undefined2 local_358;
  undefined2 uStack_356;
  undefined2 uStack_354;
  undefined2 uStack_352;
  undefined2 uStack_350;
  undefined2 uStack_34e;
  undefined2 uStack_34c;
  undefined2 uStack_34a;
  
  local_668 = SUB168(ZEXT416(7),0);
  prepare_coeffs_12tap
            ((InterpFilterParams *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
             (int)((ulong)in_stack_fffffffffffff780 >> 0x20),in_stack_fffffffffffff778);
  local_72c = 0;
  do {
    iVar11 = 0;
    do {
      convolve_lo_y_12tap(in_stack_fffffffffffff7d8,
                          (__m128i *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
      convolve_hi_y_12tap(in_stack_fffffffffffff7d8,
                          (__m128i *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
      local_3d8 = (int)extraout_XMM0_Qa;
      uStack_3d4 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
      uStack_3d0 = (int)extraout_XMM0_Qb;
      uStack_3cc = (int)((ulong)extraout_XMM0_Qb >> 0x20);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_668;
      iVar9 = uStack_3d0 + 0x40 >> auVar3;
      iVar10 = uStack_3cc + 0x40 >> auVar3;
      local_3f8 = (int)s_00;
      uStack_3f4 = (int)((ulong)s_00 >> 0x20);
      uStack_3f0 = (int)extraout_XMM0_Qb_00;
      uStack_3ec = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_668;
      auVar7._4_4_ = uStack_3d4 + 0x40 >> auVar3;
      auVar7._0_4_ = local_3d8 + 0x40 >> auVar3;
      auVar7._12_4_ = iVar10;
      auVar7._8_4_ = iVar9;
      auVar6._4_4_ = uStack_3f4 + 0x40 >> auVar2;
      auVar6._0_4_ = local_3f8 + 0x40 >> auVar2;
      auVar6._12_4_ = uStack_3ec + 0x40 >> auVar2;
      auVar6._8_4_ = uStack_3f0 + 0x40 >> auVar2;
      auVar8 = packssdw(auVar7,auVar6);
      local_358 = auVar8._0_2_;
      uStack_356 = auVar8._2_2_;
      uStack_354 = auVar8._4_2_;
      uStack_352 = auVar8._6_2_;
      uStack_350 = auVar8._8_2_;
      uStack_34e = auVar8._10_2_;
      uStack_34c = auVar8._12_2_;
      uStack_34a = auVar8._14_2_;
      *(ulong *)(in_RDX + iVar11 * in_ECX + (long)local_72c) =
           CONCAT17((0 < uStack_34a) * (uStack_34a < 0x100) * auVar8[0xe] - (0xff < uStack_34a),
                    CONCAT16((0 < uStack_34c) * (uStack_34c < 0x100) * auVar8[0xc] -
                             (0xff < uStack_34c),
                             CONCAT15((0 < uStack_34e) * (uStack_34e < 0x100) * auVar8[10] -
                                      (0xff < uStack_34e),
                                      CONCAT14((0 < uStack_350) * (uStack_350 < 0x100) * auVar8[8] -
                                               (0xff < uStack_350),
                                               CONCAT13((0 < uStack_352) * (uStack_352 < 0x100) *
                                                        auVar8[6] - (0xff < uStack_352),
                                                        CONCAT12((0 < uStack_354) *
                                                                 (uStack_354 < 0x100) * auVar8[4] -
                                                                 (0xff < uStack_354),
                                                                 CONCAT11((0 < uStack_356) *
                                                                          (uStack_356 < 0x100) *
                                                                          auVar8[2] -
                                                                          (0xff < uStack_356),
                                                                          (0 < local_358) *
                                                                          (local_358 < 0x100) *
                                                                          auVar8[0] -
                                                                          (0xff < local_358))))))));
      iVar11 = iVar11 + 1;
      s_01 = s_00;
      convolve_lo_y_12tap(s_00,(__m128i *)CONCAT44(iVar10,iVar9));
      convolve_hi_y_12tap(s_01,(__m128i *)CONCAT44(iVar10,iVar9));
      local_418 = (int)extraout_XMM0_Qa_00;
      uStack_414 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      uStack_410 = (int)extraout_XMM0_Qb_01;
      uStack_40c = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_668;
      in_stack_fffffffffffff7d0 = uStack_410 + 0x40 >> auVar1;
      in_stack_fffffffffffff7d4 = uStack_40c + 0x40 >> auVar1;
      local_438 = (int)extraout_XMM0_Qa_01;
      uStack_434 = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
      uStack_430 = (int)extraout_XMM0_Qb_02;
      uStack_42c = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_668;
      auVar5._4_4_ = uStack_414 + 0x40 >> auVar1;
      auVar5._0_4_ = local_418 + 0x40 >> auVar1;
      auVar5._12_4_ = in_stack_fffffffffffff7d4;
      auVar5._8_4_ = in_stack_fffffffffffff7d0;
      auVar4._4_4_ = uStack_434 + 0x40 >> auVar8;
      auVar4._0_4_ = local_438 + 0x40 >> auVar8;
      auVar4._12_4_ = uStack_42c + 0x40 >> auVar8;
      auVar4._8_4_ = uStack_430 + 0x40 >> auVar8;
      auVar8 = packssdw(auVar5,auVar4);
      local_378 = auVar8._0_2_;
      uStack_376 = auVar8._2_2_;
      uStack_374 = auVar8._4_2_;
      uStack_372 = auVar8._6_2_;
      uStack_370 = auVar8._8_2_;
      uStack_36e = auVar8._10_2_;
      uStack_36c = auVar8._12_2_;
      uStack_36a = auVar8._14_2_;
      *(ulong *)(in_RDX + iVar11 * in_ECX + (long)local_72c) =
           CONCAT17((0 < uStack_36a) * (uStack_36a < 0x100) * auVar8[0xe] - (0xff < uStack_36a),
                    CONCAT16((0 < uStack_36c) * (uStack_36c < 0x100) * auVar8[0xc] -
                             (0xff < uStack_36c),
                             CONCAT15((0 < uStack_36e) * (uStack_36e < 0x100) * auVar8[10] -
                                      (0xff < uStack_36e),
                                      CONCAT14((0 < uStack_370) * (uStack_370 < 0x100) * auVar8[8] -
                                               (0xff < uStack_370),
                                               CONCAT13((0 < uStack_372) * (uStack_372 < 0x100) *
                                                        auVar8[6] - (0xff < uStack_372),
                                                        CONCAT12((0 < uStack_374) *
                                                                 (uStack_374 < 0x100) * auVar8[4] -
                                                                 (0xff < uStack_374),
                                                                 CONCAT11((0 < uStack_376) *
                                                                          (uStack_376 < 0x100) *
                                                                          auVar8[2] -
                                                                          (0xff < uStack_376),
                                                                          (0 < local_378) *
                                                                          (local_378 < 0x100) *
                                                                          auVar8[0] -
                                                                          (0xff < local_378))))))));
      iVar11 = iVar11 + 1;
      in_stack_fffffffffffff7d8 = extraout_XMM0_Qa_01;
    } while (iVar11 < in_R9D);
    local_72c = local_72c + 8;
  } while (local_72c < in_R8D);
  return;
}

Assistant:

static void convolve_y_sr_12tap_sse2(const uint8_t *src, int src_stride,
                                     uint8_t *dst, int dst_stride, int w, int h,
                                     const InterpFilterParams *filter_params_y,
                                     int subpel_y_qn) {
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint8_t *src_ptr = src - fo_vert * src_stride;
  const __m128i round_const = _mm_set1_epi32((1 << FILTER_BITS) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(FILTER_BITS);
  __m128i coeffs[6];

  prepare_coeffs_12tap(filter_params_y, subpel_y_qn, coeffs);

  int j = 0;
  do {
    __m128i s[12], src10, res_lo, res_hi;
    __m128i res_lo_round, res_hi_round, res16, res;
    const uint8_t *data = &src_ptr[j];

    src10 = _mm_loadl_epi64((__m128i *)(data + 10 * src_stride));
    s[0] =
        _mm_unpacklo_epi8(_mm_loadl_epi64((__m128i *)(data + 0 * src_stride)),
                          _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)));
    s[1] =
        _mm_unpacklo_epi8(_mm_loadl_epi64((__m128i *)(data + 1 * src_stride)),
                          _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)));
    s[2] =
        _mm_unpacklo_epi8(_mm_loadl_epi64((__m128i *)(data + 2 * src_stride)),
                          _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)));
    s[3] =
        _mm_unpacklo_epi8(_mm_loadl_epi64((__m128i *)(data + 3 * src_stride)),
                          _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)));
    s[4] =
        _mm_unpacklo_epi8(_mm_loadl_epi64((__m128i *)(data + 4 * src_stride)),
                          _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)));
    s[5] =
        _mm_unpacklo_epi8(_mm_loadl_epi64((__m128i *)(data + 5 * src_stride)),
                          _mm_loadl_epi64((__m128i *)(data + 6 * src_stride)));
    s[6] =
        _mm_unpacklo_epi8(_mm_loadl_epi64((__m128i *)(data + 6 * src_stride)),
                          _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)));
    s[7] =
        _mm_unpacklo_epi8(_mm_loadl_epi64((__m128i *)(data + 7 * src_stride)),
                          _mm_loadl_epi64((__m128i *)(data + 8 * src_stride)));
    s[8] =
        _mm_unpacklo_epi8(_mm_loadl_epi64((__m128i *)(data + 8 * src_stride)),
                          _mm_loadl_epi64((__m128i *)(data + 9 * src_stride)));
    s[9] = _mm_unpacklo_epi8(
        _mm_loadl_epi64((__m128i *)(data + 9 * src_stride)), src10);

    int i = 0;
    do {
      data = &src_ptr[i * src_stride + j];
      s[10] = _mm_unpacklo_epi8(
          src10, _mm_loadl_epi64((__m128i *)(data + 11 * src_stride)));
      src10 = _mm_loadl_epi64((__m128i *)(data + 12 * src_stride));
      s[11] = _mm_unpacklo_epi8(
          _mm_loadl_epi64((__m128i *)(data + 11 * src_stride)), src10);

      res_lo = convolve_lo_y_12tap(s, coeffs);  // Filter low index pixels
      res_hi = convolve_hi_y_12tap(s, coeffs);  // Filter high index pixels

      res_lo_round =
          _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
      res_hi_round =
          _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

      res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
      res = _mm_packus_epi16(res16, res16);

      _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
      i++;

      res_lo = convolve_lo_y_12tap(s + 1, coeffs);  // Filter low index pixels
      res_hi = convolve_hi_y_12tap(s + 1, coeffs);  // Filter high index pixels

      res_lo_round =
          _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
      res_hi_round =
          _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

      res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
      res = _mm_packus_epi16(res16, res16);

      _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
      i++;

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];
      s[3] = s[5];
      s[4] = s[6];
      s[5] = s[7];
      s[6] = s[8];
      s[7] = s[9];
      s[8] = s[10];
      s[9] = s[11];
    } while (i < h);
    j += 8;
  } while (j < w);
}